

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCreateProcess
                    (CPalThread *pThread,LPCWSTR lpApplicationName,LPWSTR lpCommandLine,
                    LPSECURITY_ATTRIBUTES lpProcessAttributes,
                    LPSECURITY_ATTRIBUTES lpThreadAttributes,BOOL bInheritHandles,
                    DWORD dwCreationFlags,LPVOID lpEnvironment,LPCWSTR lpCurrentDirectory,
                    LPSTARTUPINFOW lpStartupInfo,LPPROCESS_INFORMATION lpProcessInformation)

{
  char cVar1;
  long lVar2;
  IDataLock *pIVar3;
  IPalObject *pIVar4;
  int __fd;
  byte bVar5;
  int iVar6;
  PAL_ERROR PVar7;
  errno_t eVar8;
  BOOL BVar9;
  uint uVar10;
  PAL_ERROR PVar11;
  DWORD DVar12;
  int iVar13;
  int iVar14;
  int *piVar15;
  LPWSTR string;
  LPWSTR pWVar16;
  size_t sVar17;
  char *pcVar18;
  undefined4 extraout_var;
  size_t sVar19;
  byte *_Dst;
  char **ppcVar20;
  char16_t *pcVar21;
  char16_t *pcVar22;
  byte *pbVar23;
  char **__argv;
  ssize_t sVar24;
  uint uVar25;
  ulong uVar26;
  char *pcVar27;
  undefined4 in_register_0000008c;
  undefined8 uVar28;
  char **ppcVar29;
  byte *__s;
  long in_FS_OFFSET;
  undefined8 uStack_1b8;
  CObjectAttributes oa;
  CProcProcessLocalData *pLocalData;
  CPalThread *pDummyThread;
  IPalObject *pobjProcessRegistered;
  HANDLE hDummyThread;
  HANDLE hProcess;
  IPalObject *pobjProcess;
  IDataLock *pLocalDataLock;
  IPalObject *pobjFileIn;
  IPalObject *pobjFileOut;
  IPalObject *pobjFileErr;
  LPWSTR local_148;
  int local_13c;
  int local_138;
  int iFdIn;
  int iFdOut;
  int iFdErr;
  LPWSTR local_128;
  LPWSTR local_120;
  char *local_118;
  BYTE local_109;
  undefined1 local_108 [7];
  BYTE resume_code;
  PathCharString lpFileNamePS;
  int pipe_descs [2];
  uint local_b0;
  
  uVar28 = CONCAT44(in_register_0000008c,bInheritHandles);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  hProcess = (HANDLE)0x0;
  pDummyThread = (CPalThread *)0x0;
  pobjProcess = (IPalObject *)0x0;
  pLocalData = (CProcProcessLocalData *)0x0;
  pobjProcessRegistered = (IPalObject *)0x0;
  hDummyThread = (HANDLE)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_13c = -1;
  pobjFileIn = (IPalObject *)0x0;
  local_138 = -1;
  pobjFileOut = (IPalObject *)0x0;
  iFdIn = -1;
  lpFileNamePS._32_8_ = local_108;
  lpFileNamePS.m_size = 0;
  uStack_1b8 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  PVar7 = 0x57;
  oa.sObjectName._8_8_ = lpProcessAttributes;
  if (lpApplicationName != (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x21f,uVar28);
    pcVar27 = "lpApplicationName should be NULL, but is %S instead\n";
    goto LAB_0013df42;
  }
  local_120 = lpCommandLine;
  if ((dwCreationFlags & 0xffffffeb) != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x226,uVar28);
    pcVar27 = "Unexpected creation flags (%#x)\n";
    uVar26 = (ulong)dwCreationFlags;
    goto LAB_0013dfa9;
  }
  if ((lpProcessAttributes == (LPSECURITY_ATTRIBUTES)0x0) ||
     ((lpProcessAttributes->lpSecurityDescriptor == (LPVOID)0x0 &&
      (lpProcessAttributes->bInheritHandle == 1)))) {
    if (lpThreadAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x239,uVar28);
      pcVar27 = "lpThreadAttributes parameter must be NULL (%p)\n";
      lpApplicationName = (LPCWSTR)lpThreadAttributes;
      goto LAB_0013df42;
    }
    if (lpStartupInfo == (LPSTARTUPINFOW)0x0) {
      if (!PAL_InitializeChakraCoreCalled) goto LAB_0013ef3d;
      goto LAB_0013dfbd;
    }
    if (lpStartupInfo->cb < 0x68) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x24a,uVar28);
      uVar26 = (ulong)lpStartupInfo->cb;
      pcVar27 = "lpStartupInfo parameter structure size is invalid (%u)\n";
LAB_0013dfa9:
      fprintf(_stderr,pcVar27,uVar26);
    }
    else {
      if ((lpStartupInfo->dwFlags & 0xfffffeff) != 0) {
        fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                ,0x253,uVar28);
        uVar26 = (ulong)lpStartupInfo->dwFlags;
        pcVar27 = "lpStartupInfo parameter invalid flags (%#x)\n";
        goto LAB_0013dfa9;
      }
      if ((lpStartupInfo->dwFlags == 0) ||
         (((PVar7 = PrepareStandardHandle
                              (pThread,lpStartupInfo->hStdInput,(IPalObject **)&pLocalDataLock,
                               &local_13c), PVar7 == 0 &&
           (PVar7 = PrepareStandardHandle(pThread,lpStartupInfo->hStdOutput,&pobjFileIn,&local_138),
           PVar7 == 0)) &&
          (PVar7 = PrepareStandardHandle(pThread,lpStartupInfo->hStdError,&pobjFileOut,&iFdIn),
          PVar7 == 0)))) {
        local_118 = StackString<32UL,_char>::OpenStringBuffer
                              ((StackString<32UL,_char> *)local_108,0x3ff);
        PVar7 = 8;
        if (local_118 != (char *)0x0) {
          string = UTIL_inverse_wcspbrk(local_120,W16_WHITESPACE);
          if (string == (LPWSTR)0x0) {
joined_r0x0013e4b7:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
LAB_0013e4bd:
            StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileNamePS.m_count);
          }
          else {
            if (*string == L'\"') {
              pWVar16 = PAL_wcschr(string + 2,L'\"');
              string = string + 1;
              if (pWVar16 == (char16_t *)0x0) {
                sVar17 = PAL_wcslen(string);
LAB_0013e3c7:
                pWVar16 = string + sVar17;
              }
            }
            else {
              pWVar16 = PAL_wcspbrk(string,W16_WHITESPACE);
              if (pWVar16 == (char16_t *)0x0) {
                sVar17 = PAL_wcslen(string);
                goto LAB_0013e3c7;
              }
            }
            if (pWVar16 == string) goto joined_r0x0013e4b7;
            pobjFileErr = (IPalObject *)CONCAT62(pobjFileErr._2_6_,*pWVar16);
            *pWVar16 = L'\0';
            local_128 = pWVar16;
            sVar17 = PAL_wcslen(string);
            iVar6 = (int)sVar17 * 2 + 2;
            pcVar27 = StackString<32UL,_char>::OpenStringBuffer
                                ((StackString<32UL,_char> *)&lpFileNamePS.m_count,(long)iVar6);
            if (pcVar27 == (char *)0x0) goto joined_r0x0013e4b7;
            iVar6 = WideCharToMultiByte(0,0,string,-1,pcVar27,iVar6,(LPCSTR)0x0,(LPBOOL)0x0);
            _iFdOut = pcVar27;
            if (iVar6 == 0) {
              fprintf(_stderr,"] %s %s:%d","getFileName",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                      ,0x9a1);
              pcVar27 = "WideCharToMultiByte failure\n";
LAB_0013e518:
              fprintf(_stderr,pcVar27);
              goto LAB_0013e4bd;
            }
            *local_128 = (WCHAR)pobjFileErr;
            FILEDosToUnixPathA(pcVar27);
            pcVar27 = strchr(pcVar27,0x2f);
            if (pcVar27 == (char *)0x0) {
              if (g_lpwstrAppDir != (LPWSTR)0x0) {
                iVar6 = WideCharToMultiByte(0,0,g_lpwstrAppDir,-1,local_118,0x400,(LPCSTR)0x0,
                                            (LPBOOL)0x0);
                if (iVar6 == 0) {
                  fprintf(_stderr,"] %s %s:%d","getPath",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                          ,0xb47);
                  pcVar27 = "WideCharToMultiByte failure!\n";
                  goto LAB_0013e518;
                }
                sVar19 = strlen(_iFdOut);
                if (((0x400 < (int)sVar19 + iVar6 + 2) ||
                    (eVar8 = strcat_s(local_118,0x400,"/"), eVar8 != 0)) ||
                   (eVar8 = strcat_s(local_118,0x400,_iFdOut), eVar8 != 0)) goto joined_r0x0013e4b7;
                iVar6 = access(local_118,0);
                if (iVar6 == 0) goto joined_r0x0013e9c6;
              }
              eVar8 = strcpy_s(local_118,0x400,"./");
              if ((eVar8 == 0) && (eVar8 = strcat_s(local_118,0x400,_iFdOut), eVar8 == 0)) {
                iVar6 = access(local_118,4);
                if (iVar6 == 0) goto joined_r0x0013e9c6;
                InternalGetCurrentThread();
                pcVar27 = MiscGetenv("PATH");
                sVar19 = strlen(pcVar27);
                sVar17 = (size_t)((int)sVar19 + 1);
                local_148 = (LPWSTR)InternalMalloc(sVar17);
                if (local_148 != (LPWSTR)0x0) {
                  pcVar27 = MiscGetenv("PATH");
                  eVar8 = strcpy_s((char *)local_148,sVar17,pcVar27);
                  if (eVar8 == 0) {
                    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
                    local_128 = local_148;
                    do {
                      if (local_128 == (LPWSTR)0x0) {
                        InternalFree(local_148);
                        goto joined_r0x0013e4b7;
                      }
                      pcVar27 = (char *)((long)local_128 + -1);
                      do {
                        pcVar18 = pcVar27 + 1;
                        pcVar27 = pcVar27 + 1;
                      } while (*pcVar18 == ':');
                      pcVar18 = strchr(pcVar27,0x3a);
                      if (pcVar18 == (char *)0x0) {
                        local_128 = (LPWSTR)0x0;
                      }
                      else {
                        local_128 = (LPWSTR)(pcVar18 + 1);
                        *pcVar18 = '\0';
                      }
                      sVar19 = strlen(pcVar27);
                      cVar1 = pcVar27[(int)sVar19 + -1];
                      pobjFileErr = (IPalObject *)(long)(int)((uint)(cVar1 != '/') + (int)sVar19);
                      sVar19 = strlen(_iFdOut);
                      if (0x3ff < (long)&pobjFileErr->_vptr_IPalObject + sVar19) {
                        InternalFree(local_148);
                        goto joined_r0x0013e4b7;
                      }
                      strcpy_s(local_118,0x400,pcVar27);
                      if (cVar1 != '/') {
                        strcat_s(local_118,0x400,"/");
                      }
                      strcat_s(local_118,0x400,_iFdOut);
                      iVar6 = access(local_118,0);
                    } while (iVar6 != 0);
                    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
                    InternalFree(local_148);
                    goto LAB_0013e83a;
                  }
                }
              }
              goto joined_r0x0013e4b7;
            }
            iVar6 = access(_iFdOut,0);
            if ((iVar6 != 0) || (eVar8 = strcpy_s(local_118,0x400,_iFdOut), eVar8 != 0))
            goto joined_r0x0013e4b7;
joined_r0x0013e9c6:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
LAB_0013e83a:
            StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileNamePS.m_count);
            if (0x3ff < lpFileNamePS.m_size) {
              lpFileNamePS.m_size = 0x3ff;
            }
            *(undefined1 *)(lpFileNamePS._32_8_ + lpFileNamePS.m_size) = 0;
            iVar6 = access(local_118,0);
            if ((iVar6 == 0) &&
               (iVar6 = stat64(local_118,(stat64 *)&lpFileNamePS.m_count), iVar6 != -1)) {
              if ((local_b0 & 0xf000) == 0x4000) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
                PVar7 = 5;
                goto LAB_0013dfbd;
              }
              BVar9 = UTIL_IsExecuteBitsSet((stat *)&lpFileNamePS.m_count);
              if (BVar9 != 0) {
                local_128 = (LPWSTR)CONCAT44(local_128._4_4_,0xffffffff);
                iVar6 = WideCharToMultiByte(0,0,local_120,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
                _iFdOut = (char *)CONCAT44(extraout_var,iVar6);
                if (iVar6 != 0) {
                  InternalGetCurrentThread();
                  sVar19 = strlen(local_118);
                  sVar17 = (size_t)((int)sVar19 + (int)_iFdOut + 2);
                  _Dst = (byte *)InternalMalloc(sVar17);
                  if ((((_Dst != (byte *)0x0) &&
                       (eVar8 = strcpy_s((char *)_Dst,sVar17,"\""), eVar8 == 0)) &&
                      (eVar8 = strcat_s((char *)_Dst,sVar17,local_118), eVar8 == 0)) &&
                     ((eVar8 = strcat_s((char *)_Dst,sVar17,"\""), eVar8 == 0 &&
                      (eVar8 = strcat_s((char *)_Dst,sVar17," "), eVar8 == 0)))) {
                    pobjFileErr = (IPalObject *)strlen((char *)_Dst);
                    pcVar21 = UTIL_inverse_wcspbrk(local_120,W16_WHITESPACE);
                    pbVar23 = _Dst;
                    local_120 = pcVar21;
                    if (pcVar21 != (LPWSTR)0x0) {
                      pobjFileErr = (IPalObject *)(_Dst + (long)&pobjFileErr->_vptr_IPalObject);
                      while (pcVar21 = PAL_wcspbrk(pcVar21,W16_WHITESPACE_DQUOTE),
                            pcVar21 != (char16_t *)0x0) {
                        if (*pcVar21 != L'\"') {
                          pcVar21 = pcVar21 + 1;
                          if (pcVar21 != (char16_t *)0x0) {
LAB_0013edfb:
                            iVar6 = WideCharToMultiByte(0,0,pcVar21,-1,(LPSTR)pobjFileErr,
                                                        (int)_iFdOut + 1,(LPCSTR)0x0,(LPBOOL)0x0);
                            if (iVar6 == 0) {
                              fprintf(_stderr,"] %s %s:%d","buildArgv",
                                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                                      ,0xa7f);
                              fprintf(_stderr,"Unable to convert to a multibyte string\n");
                              goto LAB_0013efe3;
                            }
                          }
                          break;
                        }
                        pcVar22 = pcVar21;
                        if ((pcVar21 <= local_120) || (pcVar21[-1] != L'\\')) {
                          do {
                            pcVar21 = pcVar22 + 1;
                            if (pcVar22[1] == L'\0') goto LAB_0013edfb;
                            pcVar21 = PAL_wcschr(pcVar21,L'\"');
                            if (pcVar21 == (char16_t *)0x0) goto LAB_0013ee99;
                            pcVar22 = pcVar21;
                          } while (pcVar21[-1] == L'\\');
                          if (*pcVar21 == L'\0') goto LAB_0013edfb;
                        }
                        pcVar21 = pcVar21 + 1;
                        if (pcVar21 == (char16_t *)0x0) break;
                      }
                    }
LAB_0013ee99:
                    do {
                      if ((*pbVar23 == 0) || (iVar6 = isspace((uint)*pbVar23), iVar6 == 0))
                      goto LAB_0013eea2;
                      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
                      *pbVar23 = 0;
                      pbVar23 = pbVar23 + 1;
                    } while( true );
                  }
                  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
                  goto LAB_0013e9b7;
                }
                fprintf(_stderr,"] %s %s:%d","buildArgv",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                        ,0xa1a);
                __argv = (char **)0x0;
                fprintf(_stderr,"Can\'t determine length of command line\n");
                goto LAB_0013ea13;
              }
            }
          }
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
          PVar7 = 2;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x231,uVar28);
    pcVar27 = "lpProcessAttributes is invalid, parameter ignored (%p)\n";
    lpApplicationName = (LPCWSTR)lpProcessAttributes;
LAB_0013df42:
    fprintf(_stderr,pcVar27,lpApplicationName);
  }
LAB_0013dfbd:
  __argv = (char **)0x0;
  ppcVar20 = (char **)0x0;
  goto LAB_0013dfc0;
LAB_0013efcd:
  (*ppcVar20)[uVar10] = '\0';
  ppcVar20 = ppcVar20 + 1;
  goto LAB_0013ef6b;
LAB_0013eea2:
  local_120 = (LPWSTR)0x0;
  while (bVar5 = *pbVar23, bVar5 != 0) {
    local_120 = (LPWSTR)(ulong)((int)local_120 + 1);
    while ((__s = pbVar23, bVar5 != 0 && (iVar6 = isspace((uint)bVar5), iVar6 == 0))) {
      if ((*pbVar23 == 0x22) && ((pbVar23 <= _Dst || (pbVar23[-1] != 0x5c)))) {
        do {
          __s = pbVar23 + 1;
          if (pbVar23[1] == 0) goto LAB_0013ef2a;
          pbVar23 = (byte *)strchr((char *)__s,0x22);
          if (pbVar23 == (byte *)0x0) goto LAB_0013ef42;
        } while (pbVar23[-1] == 0x5c);
        __s = pbVar23;
        if (*pbVar23 == 0) break;
      }
      bVar5 = pbVar23[1];
      pbVar23 = pbVar23 + 1;
    }
LAB_0013ef2a:
    while (iVar6 = isspace((uint)*__s), pbVar23 = __s, iVar6 != 0) {
      *__s = 0;
      __s = __s + 1;
    }
  }
LAB_0013ef42:
  __argv = (char **)InternalMalloc((ulong)((int)local_120 + 1) << 3);
  if (__argv != (char **)0x0) {
    ppcVar20 = __argv;
LAB_0013ef6b:
    iVar6 = (int)local_120;
    local_120 = (LPWSTR)(ulong)(iVar6 - 1);
    if (iVar6 != 0) {
      _Dst = _Dst + -1;
      do {
        pbVar23 = _Dst + 1;
        _Dst = _Dst + 1;
      } while (*pbVar23 == 0);
      *ppcVar20 = (char *)_Dst;
      uVar10 = 0;
      do {
        bVar5 = *_Dst;
        if (bVar5 != 0x22) {
          if (bVar5 == 0x5c) {
            bVar5 = 0x5c;
            if (_Dst[1] == 0x22) {
              _Dst = _Dst + 1;
              bVar5 = 0x22;
            }
          }
          else if (bVar5 == 0) goto LAB_0013efcd;
          (*ppcVar20)[uVar10] = bVar5;
          uVar10 = uVar10 + 1;
        }
        _Dst = _Dst + 1;
      } while( true );
    }
    *ppcVar20 = (char *)0x0;
    goto LAB_0013ea13;
  }
LAB_0013efe3:
  free(_Dst);
LAB_0013e9b7:
  __argv = (char **)0x0;
LAB_0013ea13:
  ppcVar20 = (char **)0x0;
  if (lpEnvironment != (LPVOID)0x0) {
    iVar6 = 0;
    while (ppcVar29 = ppcVar20, *(char *)((long)lpEnvironment + (long)ppcVar20) != '\0') {
      do {
        ppcVar20 = (char **)(ulong)((int)ppcVar29 + 1);
        pcVar27 = (char *)((long)lpEnvironment + (long)ppcVar29);
        ppcVar29 = ppcVar20;
      } while (*pcVar27 != '\0');
      iVar6 = iVar6 + 1;
    }
    ppcVar20 = (char **)InternalMalloc((ulong)(iVar6 + 1) << 3);
    uVar10 = 0;
    uVar25 = 0;
    while( true ) {
      if (*(char *)((long)lpEnvironment + (ulong)uVar10) == '\0') break;
      ppcVar20[uVar25] = (char *)((ulong)uVar10 + (long)lpEnvironment);
      do {
        uVar26 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while (*(char *)((long)lpEnvironment + uVar26) != '\0');
      uVar25 = uVar25 + 1;
    }
    ppcVar20[uVar25] = (char *)0x0;
  }
  PVar11 = (**(code **)*g_pObjectManager)(g_pObjectManager,pThread,&otProcess,&uStack_1b8,&hProcess)
  ;
  if (PVar11 == 0) {
    PVar11 = (**(code **)(*g_pObjectManager + 8))
                       (g_pObjectManager,pThread,hProcess,&aotProcess,0x1f0fff,&hDummyThread,
                        &pDummyThread);
    hProcess = (HANDLE)0x0;
    if (PVar11 == 0) {
      InternalCreateDummyThread
                (pThread,(LPSECURITY_ATTRIBUTES)0x0,(CPalThread **)&pLocalData,
                 &pobjProcessRegistered);
      local_120 = (LPWSTR)CONCAT44(local_120._4_4_,0xffffffff);
      if ((dwCreationFlags & 4) == 0) {
LAB_0013eb74:
        PVar7 = (*pDummyThread->_vptr_CPalThread[3])
                          (pDummyThread,pThread,1,&pobjProcess,&oa.pSecurityAttributes);
        if (PVar7 == 0) {
          DVar12 = fork();
          if (DVar12 != 0xffffffff) {
            if (DVar12 != 0) {
              close((int)local_128);
              (oa.pSecurityAttributes)->nLength = DVar12;
              (**pobjProcess->_vptr_IPalObject)(pobjProcess,pThread,1);
              pobjProcess = (IPalObject *)0x0;
              if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
                pLocalDataLock = (IDataLock *)0x0;
                (*pobjFileIn->_vptr_IPalObject[8])(pobjFileIn,pThread);
                pobjFileIn = (IPalObject *)0x0;
                (*pobjFileOut->_vptr_IPalObject[8])(pobjFileOut,pThread);
                pobjFileOut = (IPalObject *)0x0;
              }
              lpProcessInformation->hProcess = hDummyThread;
              lpProcessInformation->hThread = pobjProcessRegistered;
              lpProcessInformation->dwProcessId = DVar12;
              lpProcessInformation->dwThreadId_PAL_Undefined = 0;
              PVar11 = 0;
              goto joined_r0x0013ecb4;
            }
            init_count.m_val = 0;
            sigemptyset((sigset_t *)&lpFileNamePS.m_count);
            iVar6 = sigprocmask(2,(sigset_t *)&lpFileNamePS.m_count,(sigset_t *)0x0);
            if (iVar6 == 0) {
              if ((dwCreationFlags & 4) != 0) {
                local_109 = '\0';
                close((int)local_120);
                do {
                  sVar24 = read((int)local_128,&local_109,1);
                  if (sVar24 != -1) {
                    if ((sVar24 == 1) && (local_109 == '*')) {
                      close((int)local_128);
                      goto LAB_0013f028;
                    }
                    break;
                  }
                  piVar15 = __errno_location();
                } while (*piVar15 == 4);
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
                  _exit(1);
                }
                goto LAB_0013f1b6;
              }
LAB_0013f028:
              if (lpCurrentDirectory != (LPCWSTR)0x0) {
                SetCurrentDirectoryW(lpCurrentDirectory);
              }
              iVar6 = local_13c;
              if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                iVar13 = dup2(local_13c,0);
                __fd = local_138;
                if (((iVar13 == -1) || (iVar14 = dup2(local_138,1), iVar13 = iFdIn, iVar14 == -1))
                   || (iVar14 = dup2(iFdIn,2), iVar14 == -1)) goto LAB_0013f158;
                close(iVar6);
                close(__fd);
                close(iVar13);
              }
              if (ppcVar20 == (char **)0x0) {
                ppcVar20 = palEnvironment;
              }
              execve(local_118,__argv,ppcVar20);
            }
LAB_0013f158:
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              _exit(1);
            }
            goto LAB_0013f1b6;
          }
          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x325);
          fprintf(_stderr,"Unable to create a new process with fork()\n");
          PVar7 = 0x54f;
          if ((int)local_128 != -1) {
            close((int)local_128);
            close((int)local_120);
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x31b);
          fprintf(_stderr,"Unable to obtain local data for new process object\n");
        }
      }
      else {
        iVar6 = pipe((int *)&lpFileNamePS.m_count);
        if (iVar6 != -1) {
          local_120 = (LPWSTR)CONCAT44(local_120._4_4_,lpFileNamePS.m_count._4_4_);
          *(undefined4 *)(pLocalData + 0x49c) = lpFileNamePS.m_count._4_4_;
          local_128 = (LPWSTR)CONCAT44(local_128._4_4_,(undefined4)lpFileNamePS.m_count);
          goto LAB_0013eb74;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
        piVar15 = __errno_location();
        strerror(*piVar15);
      }
      goto LAB_0013dfc0;
    }
  }
joined_r0x0013ecb4:
  PVar7 = PVar11;
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
LAB_0013dfc0:
  if (pobjProcess != (IPalObject *)0x0) {
    (**pobjProcess->_vptr_IPalObject)(pobjProcess,pThread,0);
  }
  if (hProcess != (HANDLE)0x0) {
    (**(code **)(*hProcess + 0x40))(hProcess,pThread);
  }
  if (pDummyThread != (CPalThread *)0x0) {
    (*pDummyThread->_vptr_CPalThread[8])(pDummyThread,pThread);
  }
  if (PVar7 != 0) {
    if (hDummyThread != (HANDLE)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread);
    }
    if (pobjProcessRegistered != (IPalObject *)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread);
    }
  }
  if (ppcVar20 != (char **)0x0) {
    free(ppcVar20);
  }
  pIVar3 = pLocalDataLock;
  if (pLocalDataLock != (IDataLock *)0x0) {
    iVar6 = fcntl64(local_13c,2,1);
    if (iVar6 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
      piVar15 = __errno_location();
      strerror(*piVar15);
    }
    (*pIVar3->_vptr_IDataLock[8])(pIVar3,pThread);
  }
  pIVar4 = pobjFileIn;
  if (pobjFileIn != (IPalObject *)0x0) {
    iVar6 = fcntl64(local_138,2,1);
    if (iVar6 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013ef3d;
      piVar15 = __errno_location();
      strerror(*piVar15);
    }
    (*pIVar4->_vptr_IPalObject[8])(pIVar4,pThread);
  }
  pIVar4 = pobjFileOut;
  if (pobjFileOut != (IPalObject *)0x0) {
    iVar6 = fcntl64(iFdIn,2,1);
    if (iVar6 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0013ef3d:
        abort();
      }
      piVar15 = __errno_location();
      strerror(*piVar15);
    }
    (*pIVar4->_vptr_IPalObject[8])(pIVar4,pThread);
  }
  if (__argv != (char **)0x0) {
    free(*__argv);
    free(__argv);
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return PVar7;
  }
LAB_0013f1b6:
  __stack_chk_fail();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateProcess(
    CPalThread *pThread,
    LPCWSTR lpApplicationName,
    LPWSTR lpCommandLine,
    LPSECURITY_ATTRIBUTES lpProcessAttributes,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    BOOL bInheritHandles,
    DWORD dwCreationFlags,
    LPVOID lpEnvironment,
    LPCWSTR lpCurrentDirectory,
    LPSTARTUPINFOW lpStartupInfo,
    LPPROCESS_INFORMATION lpProcessInformation
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IPalObject *pobjProcessRegistered = NULL;
    IDataLock *pLocalDataLock = NULL;
    CProcProcessLocalData *pLocalData;
    IDataLock *pSharedDataLock = NULL;
    CPalThread *pDummyThread = NULL;
    HANDLE hDummyThread = NULL;
    HANDLE hProcess = NULL;
    CObjectAttributes oa(NULL, lpProcessAttributes);

    IPalObject *pobjFileIn = NULL;
    int iFdIn = -1;
    IPalObject *pobjFileOut = NULL;
    int iFdOut = -1;
    IPalObject *pobjFileErr = NULL;
    int iFdErr = -1;

    pid_t processId;
    char * lpFileName;
    PathCharString lpFileNamePS;
    char **lppArgv = NULL;
    UINT nArg;
    int  iRet;
    char **EnvironmentArray=NULL;
    int child_blocking_pipe = -1;
    int parent_blocking_pipe = -1;

    /* Validate parameters */

    /* note : specs indicate lpApplicationName should always
       be NULL; however support for it is already implemented. Leaving the code
       in, specs can change; but rejecting non-NULL for now to conform to the
       spec. */
    if( NULL != lpApplicationName )
    {
        ASSERT("lpApplicationName should be NULL, but is %S instead\n",
               lpApplicationName);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (0 != (dwCreationFlags & ~(CREATE_SUSPENDED|CREATE_NEW_CONSOLE)))
    {
        ASSERT("Unexpected creation flags (%#x)\n", dwCreationFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Security attributes parameters are ignored */
    if (lpProcessAttributes != NULL &&
        (lpProcessAttributes->lpSecurityDescriptor != NULL ||
         lpProcessAttributes->bInheritHandle != TRUE))
    {
        ASSERT("lpProcessAttributes is invalid, parameter ignored (%p)\n",
               lpProcessAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (lpThreadAttributes != NULL)
    {
        ASSERT("lpThreadAttributes parameter must be NULL (%p)\n",
               lpThreadAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* note : Win32 crashes in this case */
    if(NULL == lpStartupInfo)
    {
        ERROR("lpStartupInfo is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Validate lpStartupInfo.cb field */
    if (lpStartupInfo->cb < sizeof(STARTUPINFOW))
    {
        ASSERT("lpStartupInfo parameter structure size is invalid (%u)\n",
              lpStartupInfo->cb);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* lpStartupInfo should be either zero or STARTF_USESTDHANDLES */
    if (lpStartupInfo->dwFlags & ~STARTF_USESTDHANDLES)
    {
        ASSERT("lpStartupInfo parameter invalid flags (%#x)\n",
              lpStartupInfo->dwFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* validate given standard handles if we have any */
    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdInput,
            &pobjFileIn,
            &iFdIn
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdOutput,
            &pobjFileOut,
            &iFdOut
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdError,
            &pobjFileErr,
            &iFdErr
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }
    }

    lpFileName = lpFileNamePS.OpenStringBuffer(MAX_LONGPATH-1);
    if (NULL == lpFileName)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto InternalCreateProcessExit;
    }
    if (!getFileName(lpApplicationName, lpCommandLine, lpFileName))
    {
        ERROR("Can't find executable!\n");
        palError = ERROR_FILE_NOT_FOUND;
        goto InternalCreateProcessExit;
    }

    lpFileNamePS.CloseBuffer(MAX_LONGPATH-1);
    /* check type of file */
    iRet = checkFileType(lpFileName);

    switch (iRet)
    {
        case FILE_ERROR: /* file not found, or not an executable */
            WARN ("File is not valid (%s)", lpFileName);
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;

        case FILE_UNIX: /* Unix binary file */
            break;  /* nothing to do */

        case FILE_DIR:/*Directory*/
            WARN ("File is a Directory (%s)", lpFileName);
            palError = ERROR_ACCESS_DENIED;
            goto InternalCreateProcessExit;
            break;

        default: /* not supposed to get here */
            ASSERT ("Invalid return type from checkFileType");
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;
    }

    /* build Argument list, lppArgv is allocated in buildArgv function and
       requires to be freed */
    lppArgv = buildArgv(lpCommandLine, lpFileName, &nArg);

    /* set the Environment variable */
    if (lpEnvironment != NULL)
    {
        unsigned i;
        // Since CREATE_UNICODE_ENVIRONMENT isn't supported we know the string is ansi
        unsigned EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentEntries++;
        EnvironmentArray = (char **)InternalMalloc(EnvironmentEntries * sizeof(char *));

        EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentArray[EnvironmentEntries] = &((char *)lpEnvironment)[i];
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentArray[EnvironmentEntries] = NULL;
    }

    //
    // Allocate and register the process object for the new process
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to allocate object for new process\n");
        goto InternalCreateProcessExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        PROCESS_ALL_ACCESS,
        &hProcess,
        &pobjProcessRegistered
        );

    //
    // pobjProcess is invalidated by the above call, so
    // NULL it out here
    //

    pobjProcess = NULL;

    if (NO_ERROR != palError)
    {
        ERROR("Unable to register new process object\n");
        goto InternalCreateProcessExit;
    }

    //
    // Create a new "dummy" thread object
    //

    palError = InternalCreateDummyThread(
        pThread,
        lpThreadAttributes,
        &pDummyThread,
        &hDummyThread
        );

    if (dwCreationFlags & CREATE_SUSPENDED)
    {
        int pipe_descs[2];

        if (-1 == pipe(pipe_descs))
        {
            ERROR("pipe() failed! error is %d (%s)\n", errno, strerror(errno));
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto InternalCreateProcessExit;
        }

        /* [0] is read end, [1] is write end */
        pDummyThread->suspensionInfo.SetBlockingPipe(pipe_descs[1]);
        parent_blocking_pipe = pipe_descs[1];
        child_blocking_pipe = pipe_descs[0];
    }

    palError = pobjProcessRegistered->GetProcessLocalData(
        pThread,
        WriteLock,
        &pLocalDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to obtain local data for new process object\n");
        goto InternalCreateProcessExit;
    }


    /* fork the new process */
    processId = fork();

    if (processId == -1)
    {
        ASSERT("Unable to create a new process with fork()\n");
        if (-1 != child_blocking_pipe)
        {
            close(child_blocking_pipe);
            close(parent_blocking_pipe);
        }

        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreateProcessExit;
    }

    /* From the time the child process begins running, to when it reaches execve,
    the child process is not a real PAL process and does not own any PAL
    resources, although it has access to the PAL resources of its parent process.
    Thus, while the child process is in this window, it is dangerous for it to affect
    its parent's PAL resources. As a consequence, no PAL code should be used
    in this window; all code should make unix calls. Note the use of _exit
    instead of exit to avoid calling PAL_Terminate and the lack of TRACE's and
    ASSERT's. */

    if (processId == 0)  /* child process */
    {
        // At this point, the PAL should be considered uninitialized for this child process.

        // Don't want to enter the init_critsec here since we're trying to avoid
        // calling PAL functions. Furthermore, nothing should be changing
        // the init_count in the child process at this point since this is the only
        // thread executing.
        init_count = 0;

        sigset_t sm;

        //
        // Clear out the signal mask for the new process.
        //

        sigemptyset(&sm);
        iRet = sigprocmask(SIG_SETMASK, &sm, NULL);
        if (iRet != 0)
        {
            _exit(EXIT_FAILURE);
        }

        if (dwCreationFlags & CREATE_SUSPENDED)
        {
            BYTE resume_code = 0;
            ssize_t read_ret;

            /* close the write end of the pipe, the child doesn't need it */
            close(parent_blocking_pipe);

            read_again:
            /* block until ResumeThread writes something to the pipe */
            read_ret = read(child_blocking_pipe, &resume_code, sizeof(resume_code));
            if (sizeof(resume_code) != read_ret)
            {
                if (read_ret == -1 && EINTR == errno)
                {
                    goto read_again;
                }
                else
                {
                    /* note : read might return 0 (and return EAGAIN) if the other
                       end of the pipe gets closed - for example because the parent
                       process dies (very) abruptly */
                    _exit(EXIT_FAILURE);
                }
            }
            if (WAKEUPCODE != resume_code)
            {
                // resume_code should always equal WAKEUPCODE.
                _exit(EXIT_FAILURE);
            }

            close(child_blocking_pipe);
        }

        /* Set the current directory */
        if (lpCurrentDirectory)
        {
            SetCurrentDirectoryW(lpCurrentDirectory);
        }

        /* Set the standard handles to the incoming values */
        if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
        {
            /* For each handle, we need to duplicate the incoming unix
               fd to the corresponding standard one.  The API that I use,
               dup2, will copy the source to the destination, automatically
               closing the existing destination, in an atomic way */
            if (dup2(iFdIn, STDIN_FILENO) == -1)
            {
                // Didn't duplicate standard in.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdOut, STDOUT_FILENO) == -1)
            {
                // Didn't duplicate standard out.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdErr, STDERR_FILENO) == -1)
            {
                // Didn't duplicate standard error.
                _exit(EXIT_FAILURE);
            }

            /* now close the original FDs, we don't need them anymore */
            close(iFdIn);
            close(iFdOut);
            close(iFdErr);
        }

        /* execute the new process */

        if (EnvironmentArray)
        {
            execve(lpFileName, lppArgv, EnvironmentArray);
        }
        else
        {
            execve(lpFileName, lppArgv, palEnvironment);
        }

        /* if we get here, it means the execve function call failed so just exit */
        _exit(EXIT_FAILURE);
    }

    /* parent process */

    /* close the read end of the pipe, the parent doesn't need it */
    close(child_blocking_pipe);

    /* Set the process ID */
    pLocalData->dwProcessId = processId;
    pLocalDataLock->ReleaseLock(pThread, TRUE);
    pLocalDataLock = NULL;

    //
    // Release file handle info; we don't need them anymore. Note that
    // this must happen after we've released the data locks, as
    // otherwise a deadlock could result.
    //

    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        pobjFileIn->ReleaseReference(pThread);
        pobjFileIn = NULL;
        pobjFileOut->ReleaseReference(pThread);
        pobjFileOut = NULL;
        pobjFileErr->ReleaseReference(pThread);
        pobjFileErr = NULL;
    }

    /* fill PROCESS_INFORMATION structure */
    lpProcessInformation->hProcess = hProcess;
    lpProcessInformation->hThread = hDummyThread;
    lpProcessInformation->dwProcessId = processId;
    lpProcessInformation->dwThreadId_PAL_Undefined = 0;


    TRACE("New process created: id=%#x\n", processId);

InternalCreateProcessExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pSharedDataLock)
    {
        pSharedDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    if (NULL != pobjProcessRegistered)
    {
        pobjProcessRegistered->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError)
    {
        if (NULL != hProcess)
        {
            g_pObjectManager->RevokeHandle(pThread, hProcess);
        }

        if (NULL != hDummyThread)
        {
            g_pObjectManager->RevokeHandle(pThread, hDummyThread);
        }
    }

    if (EnvironmentArray)
    {
        free(EnvironmentArray);
    }

    /* if we still have the file structures at this point, it means we
       encountered an error sometime between when we acquired them and when we
       fork()ed. We not only have to release them, we have to give them back
       their close-on-exec flag */
    if (NULL != pobjFileIn)
    {
        if(-1 == fcntl(iFdIn, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdin descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileIn->ReleaseReference(pThread);
    }

    if (NULL != pobjFileOut)
    {
        if(-1 == fcntl(iFdOut, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdout descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileOut->ReleaseReference(pThread);
    }

    if (NULL != pobjFileErr)
    {
        if(-1 == fcntl(iFdErr, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stderr descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileErr->ReleaseReference(pThread);
    }

    /* free allocated memory */
    if (lppArgv)
    {
        free(*lppArgv);
        free(lppArgv);
    }

    return palError;
}